

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O0

bool __thiscall
tinyusdz::usdc::USDCReader::Impl::ParseVariantSetFields
          (Impl *this,FieldValuePairVector *fvs,
          vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *variantChildren)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *__x;
  ostream *poVar2;
  string local_3a0;
  ostringstream local_380 [8];
  ostringstream ss_w;
  string local_208;
  string local_1e8;
  ostringstream local_1c8 [8];
  ostringstream ss_e;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *pv;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>
  *fv;
  const_iterator __end2;
  const_iterator __begin2;
  FieldValuePairVector *__range2;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *variantChildren_local;
  FieldValuePairVector *fvs_local;
  Impl *this_local;
  
  __end2 = ::std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>
           ::begin(fvs);
  fv = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>
        *)::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>
          ::end(fvs);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>_>
                                *)&fv);
    if (!bVar1) {
      return true;
    }
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __gnu_cxx::
            __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>_>
            ::operator*(&__end2);
    bVar1 = ::std::operator==(__lhs,"variantChildren");
    if (bVar1) {
      __x = crate::CrateValue::as<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                      ((CrateValue *)(__lhs + 0x20));
      if (__x == (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)0x0) {
        ::std::__cxx11::ostringstream::ostringstream(local_1c8);
        poVar2 = ::std::operator<<((ostream *)local_1c8,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,"[USDC]");
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseVariantSetFields");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x904);
        ::std::operator<<(poVar2," ");
        poVar2 = ::std::operator<<((ostream *)local_1c8,
                                   "`variantChildren` must be type `token[]`, but got type `");
        crate::CrateValue::type_name_abi_cxx11_(&local_1e8,(CrateValue *)(__lhs + 0x20));
        poVar2 = ::std::operator<<(poVar2,(string *)&local_1e8);
        poVar2 = ::std::operator<<(poVar2,"`");
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)&local_1e8);
        ::std::__cxx11::ostringstream::str();
        PushError(this,&local_208);
        ::std::__cxx11::string::~string((string *)&local_208);
        ::std::__cxx11::ostringstream::~ostringstream(local_1c8);
        return false;
      }
      std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator=
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)variantChildren,
                 (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)__x);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_380);
      poVar2 = ::std::operator<<((ostream *)local_380,"[warn]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseVariantSetFields");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x908);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)local_380,"VariantSet field TODO: ");
      poVar2 = ::std::operator<<(poVar2,(string *)__lhs);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::ostringstream::str();
      PushWarn(this,&local_3a0);
      ::std::__cxx11::string::~string((string *)&local_3a0);
      ::std::__cxx11::ostringstream::~ostringstream(local_380);
    }
    __gnu_cxx::
    __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

bool USDCReader::Impl::ParseVariantSetFields(
    const crate::FieldValuePairVector &fvs,
    std::vector<value::token> &variantChildren) {
  // Fields for Prim and Prim metas.
  for (const auto &fv : fvs) {
    if (fv.first == "variantChildren") {
      if (auto pv = fv.second.as<std::vector<value::token>>()) {
        variantChildren = (*pv);
        DCOUT("variantChildren: " << variantChildren);
      } else {
        PUSH_ERROR_AND_RETURN_TAG(
            kTag, "`variantChildren` must be type `token[]`, but got type `"
                      << fv.second.type_name() << "`");
      }
    } else {
      DCOUT("VariantSet field TODO: " << fv.first);
      PUSH_WARN("VariantSet field TODO: " << fv.first);
    }
  }

  return true;
}